

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::CallIExtended
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,CallIExtendedOptions options,void *buffer,uint byteCount,
          ProfileId callSiteId,CallFlags callFlags)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot returnValueRegister_00;
  undefined4 *puVar4;
  ulong uVar5;
  uint lineNumber;
  uint32 spreadArgsOffset;
  undefined4 uVar6;
  CacheIdUnit local_58;
  CacheIdUnit unit;
  ushort local_3c;
  ushort local_3a;
  RegSlot local_38;
  ProfileId profileId;
  ProfileId profileId2;
  OpCode op_local;
  
  profileId2 = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)((uint)(callFlags != CallFlags_None) * 3 + 0x26));
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x42a,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_007cc7f1;
    *puVar4 = 0;
  }
  if (returnValueRegister == 0xffffffff) {
    returnValueRegister_00 = 0xffffffff;
  }
  else {
    returnValueRegister_00 = ConsumeReg(this,returnValueRegister);
  }
  local_38 = ConsumeReg(this,functionRegister);
  local_58.cacheId = 0xffffffff;
  JsUtil::
  BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::TryGetValueAndRemove(this->callRegToLdFldCacheIndexMap,&local_38,&local_58);
  local_3a = 0xffff;
  local_3c = callSiteId;
  uVar5 = (ulong)(profileId2 - 0x1f);
  if ((ushort)(profileId2 - 0x1f) < 4) {
    bVar3 = DoDynamicProfileOpcode(this,InlinePhase,false);
    if ((callSiteId == 0xffff) || (!bVar3)) {
      bVar3 = DoDynamicProfileOpcode(this,AggressiveIntTypeSpecPhase,false);
      if (!bVar3) {
        uVar6._0_1_ = false;
        uVar6._1_3_ = 0;
        bVar3 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false);
        unit.cacheId = 0;
        if (!bVar3) goto LAB_007cc584;
      }
      uVar1 = this->m_functionWrite->profiledReturnTypeCount;
      uVar5 = (ulong)uVar1;
      if (uVar1 == 0xffff) goto LAB_007cc54f;
      this->m_functionWrite->profiledReturnTypeCount = uVar1 + 1;
      local_3c = uVar1;
      profileId2 = OpCodeUtil::ConvertCallOpToProfiledReturnType(profileId2);
LAB_007cc57f:
      unit.cacheId = (uint)CONCAT71((int7)(uVar5 >> 8),1);
      uVar6._0_1_ = false;
      uVar6._1_3_ = 0;
    }
    else {
      uVar6._0_1_ = false;
      uVar6._1_3_ = 0;
      profileId2 = OpCodeUtil::ConvertCallOpToProfiled(profileId2,false);
LAB_007cc51f:
      unit.cacheId = (uint)CONCAT71((int7)(uVar5 >> 8),1);
    }
  }
  else {
    bVar3 = DoProfileNewScObjArrayOp(this,profileId2);
    if (bVar3) {
      bVar3 = DoDynamicProfileOpcode(this,NativeArrayPhase,true);
      if (bVar3) {
        if (callSiteId != 0xffff) {
LAB_007cc4f4:
          uVar1 = this->m_functionWrite->profiledArrayCallSiteCount;
          uVar5 = (ulong)uVar1;
          if (uVar1 != 0xffff) {
            this->m_functionWrite->profiledArrayCallSiteCount = uVar1 + 1;
            local_3a = uVar1;
            OpCodeUtil::ConvertNonCallOpToProfiled(&profileId2);
            uVar6 = (undefined4)CONCAT71((uint7)(uint3)(returnValueRegister >> 8),1);
            goto LAB_007cc51f;
          }
        }
      }
      else {
        bVar3 = DoDynamicProfileOpcode(this,InlinePhase,true);
        if ((callSiteId != 0xffff) && (bVar3)) goto LAB_007cc4f4;
      }
    }
    bVar3 = DoProfileNewScObjectOp(this,profileId2);
    if (bVar3) {
      bVar3 = DoDynamicProfileOpcode(this,InlinePhase,true);
      if (bVar3) {
        if (callSiteId != 0xffff) goto LAB_007cc576;
      }
      else {
        bVar3 = DoDynamicProfileOpcode(this,FixedNewObjPhase,true);
        uVar6._0_1_ = false;
        uVar6._1_3_ = 0;
        if (callSiteId != 0xffff) {
          uVar5 = 0;
          unit.cacheId = 0;
          if (!bVar3) goto LAB_007cc584;
LAB_007cc576:
          OpCodeUtil::ConvertNonCallOpToProfiled(&profileId2);
          goto LAB_007cc57f;
        }
      }
    }
LAB_007cc54f:
    uVar6._0_1_ = false;
    uVar6._1_3_ = 0;
    unit.cacheId = 0;
  }
LAB_007cc584:
  spreadArgsOffset = 0;
  unit._4_4_ = uVar6;
  if ((options & CallIExtended_SpreadArgs) != CallIExtended_None) {
    if (buffer == (void *)0x0 || byteCount == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x460,"(buffer != nullptr && byteCount > 0)",
                                  "buffer != nullptr && byteCount > 0");
      if (!bVar3) goto LAB_007cc7f1;
      *puVar4 = 0;
    }
    spreadArgsOffset = InsertAuxiliaryData(this,buffer,byteCount);
  }
  if (callFlags == CallFlags_None) {
    bVar3 = TryWriteCallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,profileId2,returnValueRegister_00,local_38,givenArgCount,options,
                       spreadArgsOffset);
    if (((bVar3) ||
        (bVar3 = TryWriteCallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                           (this,profileId2,returnValueRegister_00,local_38,givenArgCount,options,
                            spreadArgsOffset), bVar3)) ||
       (bVar3 = TryWriteCallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,profileId2,returnValueRegister_00,local_38,givenArgCount,options,
                           spreadArgsOffset), bVar3)) goto LAB_007cc7b4;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    lineNumber = 0x477;
  }
  else {
    bVar3 = TryWriteCallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,profileId2,returnValueRegister_00,local_38,givenArgCount,options,
                       spreadArgsOffset,callFlags);
    if (((bVar3) ||
        (bVar3 = TryWriteCallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                           (this,profileId2,returnValueRegister_00,local_38,givenArgCount,options,
                            spreadArgsOffset,callFlags), bVar3)) ||
       (bVar3 = TryWriteCallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,profileId2,returnValueRegister_00,local_38,givenArgCount,options,
                           spreadArgsOffset,callFlags), bVar3)) goto LAB_007cc7b4;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    lineNumber = 0x473;
  }
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,lineNumber,"(success)","success");
  if (!bVar3) {
LAB_007cc7f1:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar4 = 0;
LAB_007cc7b4:
  if ((char)unit.cacheId != '\0') {
    Data::Write(&this->m_byteCodeData,&local_3c,2);
    if (unit.isRootObjectCache != false) {
      Data::Write(&this->m_byteCodeData,&local_3a,2);
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::CallIExtended(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, CallIExtendedOptions options, const void *buffer, uint byteCount, ProfileId callSiteId, CallFlags callFlags)
    {
        CheckOpen();
        bool hasCallFlags = !(callFlags == CallFlags_None);
        if (hasCallFlags)
        {
            CheckOp(op, OpLayoutType::CallIExtendedFlags);
        }
        else
        {
            CheckOp(op, OpLayoutType::CallIExtended);
        }
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        // givenArgCount could be <, ==, or > than Function's "InParams" count

        if (returnValueRegister != Js::Constants::NoRegister)
        {
            returnValueRegister = ConsumeReg(returnValueRegister);
        }
        functionRegister = ConsumeReg(functionRegister);

        // CallISpread is not going to use the ldFld cache index, but still remove it from the map as we expect
        // the entry for a cache index to be removed once we have seen the corresponding call.
        CacheIdUnit unit;
        unit.cacheId = Js::Constants::NoInlineCacheIndex;
        callRegToLdFldCacheIndexMap->TryGetValueAndRemove(functionRegister, &unit);

        bool isProfiled = false, isProfiled2 = false;
        ProfileId profileId = callSiteId, profileId2 = Constants::NoProfileId;
        bool isCallWithICIndex = false;

        if (DoProfileCallOp(op))
        {
            if (DoDynamicProfileOpcode(InlinePhase) &&
                callSiteId != Js::Constants::NoProfileId)
            {
                op = Js::OpCodeUtil::ConvertCallOpToProfiled(op);
                isProfiled = true;
            }
            else if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                this->m_functionWrite->AllocProfiledReturnTypeId(&profileId))
            {
                op = Js::OpCodeUtil::ConvertCallOpToProfiledReturnType(op);
                isProfiled = true;
            }
        }
        else if (DoProfileNewScObjArrayOp(op) &&
            (DoDynamicProfileOpcode(NativeArrayPhase, true) || DoDynamicProfileOpcode(InlinePhase, true)) &&
            callSiteId != Js::Constants::NoProfileId &&
            this->m_functionWrite->AllocProfiledArrayCallSiteId(&profileId2))
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
            isProfiled2 = true;
        }
        else if (DoProfileNewScObjectOp(op) && (DoDynamicProfileOpcode(InlinePhase, true) || DoDynamicProfileOpcode(FixedNewObjPhase, true)) &&
            callSiteId != Js::Constants::NoProfileId)
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
        }

        uint spreadArgsOffset = 0;
        if (options & CallIExtended_SpreadArgs)
        {
            Assert(buffer != nullptr && byteCount > 0);
            spreadArgsOffset = InsertAuxiliaryData(buffer, byteCount);
        }

        if (isCallWithICIndex)
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtendedFlagsWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache, options, spreadArgsOffset, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtendedWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache, options, spreadArgsOffset);
            }
        }
        else
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtendedFlags, op, returnValueRegister, functionRegister, givenArgCount, options, spreadArgsOffset, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallIExtended, op, returnValueRegister, functionRegister, givenArgCount, options, spreadArgsOffset);
            }
        }

        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
            if (isProfiled2)
            {
                m_byteCodeData.Encode(&profileId2, sizeof(Js::ProfileId));
            }
        }
    }